

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_memory_array.h
# Opt level: O2

void __thiscall
SharedMemoryArray<unsigned_int>::~SharedMemoryArray(SharedMemoryArray<unsigned_int> *this)

{
  int iVar1;
  ContextManager *pCVar2;
  string local_30;
  
  iVar1 = free_shared_memory(this->ptr_,4);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_30,"Cannot free shared memory at %p: %m",this->ptr_);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

~SharedMemoryArray() {
        if (free_shared_memory(ptr_, sizeof(T)) != 0) {
            die(format("Cannot free shared memory at %p: %m", ptr_));
        }
    }